

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

test_suite * init_unit_test_suite(int argc,char **argv)

{
  void *pvVar1;
  const_string *pcVar2;
  master_test_suite_t *pmVar3;
  shared_ptr<DataFileTest> *user_test_case;
  test_suite *this;
  const_string *name;
  test_case *ptVar4;
  void *pvVar5;
  test_suite *ptVar6;
  shared_ptr<DataFileTest> t7;
  test_suite *ts_7;
  shared_ptr<DataFileTest> t8;
  test_suite *ts_6;
  shared_ptr<DataFileTest> t6;
  test_suite *ts_5;
  shared_ptr<DataFileTest> t5;
  test_suite *ts_4;
  shared_ptr<DataFileTest> t4;
  test_suite *ts_3;
  shared_ptr<DataFileTest> t3;
  test_suite *ts_2;
  shared_ptr<DataFileTest> t2;
  test_suite *ts_1;
  shared_ptr<DataFileTest> t1;
  test_suite *ts;
  shared_ptr<DataFileTest> *in_stack_fffffffffffff868;
  shared_ptr<DataFileTest> *in_stack_fffffffffffff870;
  undefined8 in_stack_fffffffffffff878;
  uint timeout;
  counter_t in_stack_fffffffffffff880;
  undefined1 *expected_failures;
  test_unit *in_stack_fffffffffffff888;
  test_suite *in_stack_fffffffffffff890;
  test_suite *ptVar7;
  char *in_stack_fffffffffffff898;
  DataFileTest *in_stack_fffffffffffff8a0;
  size_t in_stack_fffffffffffff908;
  const_string *in_stack_fffffffffffff910;
  const_string *in_stack_fffffffffffff918;
  test_suite *in_stack_fffffffffffff920;
  shared_ptr<DataFileTest> *in_stack_fffffffffffff958;
  size_t in_stack_fffffffffffff960;
  const_string *in_stack_fffffffffffff968;
  const_string *tc_file;
  const_string *in_stack_fffffffffffff970;
  TestMethod in_stack_fffffffffffff978;
  shared_ptr<DataFileTest> *in_stack_fffffffffffffae8;
  test_suite *in_stack_fffffffffffffaf0;
  basic_cstring<const_char> local_4f0;
  code *local_4e0;
  undefined8 local_4d8;
  basic_cstring<const_char> local_4b0 [4];
  test_suite *local_470;
  void *local_438;
  code *local_430;
  undefined8 local_428;
  basic_cstring<const_char> local_400 [4];
  test_suite *local_3c0;
  code *local_3b8;
  undefined8 local_3b0;
  basic_cstring<const_char> local_388 [4];
  void *local_348;
  code *local_340;
  undefined8 local_338;
  basic_cstring<const_char> local_310;
  code *local_300;
  undefined8 local_2f8;
  basic_cstring<const_char> local_2d0 [4];
  const_string *local_290;
  code *local_288;
  undefined8 local_280;
  basic_cstring<const_char> local_258;
  code *local_248;
  undefined8 local_240;
  basic_cstring<const_char> local_218;
  code *local_208;
  undefined8 local_200;
  basic_cstring<const_char> local_1d8;
  code *local_1c8;
  undefined8 local_1c0;
  basic_cstring<const_char> local_198;
  code *local_188;
  undefined8 local_180;
  basic_cstring<const_char> local_158 [4];
  void *local_118;
  code *local_110;
  undefined8 local_108;
  basic_cstring<const_char> local_e0 [4];
  void *local_a0;
  code *local_98;
  undefined8 local_90;
  basic_cstring<const_char> local_68 [5];
  void *local_18;
  
  timeout = (uint)((ulong)in_stack_fffffffffffff878 >> 0x20);
  pvVar1 = operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::test_suite::test_suite
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908);
  local_18 = pvVar1;
  operator_new(0x28);
  DataFileTest::DataFileTest
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
             (char *)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>
            ((shared_ptr<DataFileTest> *)in_stack_fffffffffffff890,
             (DataFileTest *)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_68,"&DataFileTest::testWrite",0x18);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_98 = DataFileTest::testWrite;
  local_90 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x2158df);
  addReaderTests(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x215961);
  pvVar1 = operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::test_suite::test_suite
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908);
  local_a0 = pvVar1;
  operator_new(0x28);
  DataFileTest::DataFileTest
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
             (char *)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>
            ((shared_ptr<DataFileTest> *)in_stack_fffffffffffff890,
             (DataFileTest *)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_e0,"&DataFileTest::testWriteGeneric",0x1f);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_110 = DataFileTest::testWriteGeneric;
  local_108 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x215afa);
  addReaderTests(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x215b7c);
  pvVar1 = operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::test_suite::test_suite
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908);
  local_118 = pvVar1;
  operator_new(0x28);
  DataFileTest::DataFileTest
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
             (char *)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>
            ((shared_ptr<DataFileTest> *)in_stack_fffffffffffff890,
             (DataFileTest *)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_158,"&DataFileTest::testWriteDouble",0x1e);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_188 = DataFileTest::testWriteDouble;
  local_180 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x215d15);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_198,"&DataFileTest::testReadDouble",0x1d);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_1c8 = DataFileTest::testReadDouble;
  local_1c0 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x215df3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1d8,"&DataFileTest::testReadDoubleTwoStep",0x24);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_208 = DataFileTest::testReadDoubleTwoStep;
  local_200 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x215ed1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_218,"&DataFileTest::testReadDoubleTwoStepProject",0x2b);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_248 = DataFileTest::testReadDoubleTwoStepProject;
  local_240 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x215faf);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_258,"&DataFileTest::testCleanup",0x1a);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_288 = DataFileTest::testCleanup;
  local_280 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x21608d);
  boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x2160f8);
  pcVar2 = (const_string *)operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::test_suite::test_suite
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908);
  local_290 = pcVar2;
  operator_new(0x28);
  DataFileTest::DataFileTest
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
             (char *)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>
            ((shared_ptr<DataFileTest> *)in_stack_fffffffffffff890,
             (DataFileTest *)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_2d0,"&DataFileTest::testTruncate",0x1b);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_300 = DataFileTest::testTruncate;
  local_2f8 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x216291);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_310,"&DataFileTest::testCleanup",0x1a);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_340 = DataFileTest::testCleanup;
  local_338 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x21636f);
  pmVar3 = boost::unit_test::framework::master_test_suite();
  pcVar2 = (const_string *)0x0;
  if (local_290 != (const_string *)0x0) {
    pcVar2 = (const_string *)&local_290->m_end;
  }
  tc_file = local_290;
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x2163da);
  pvVar1 = operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::test_suite::test_suite
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908);
  local_348 = pvVar1;
  user_test_case = (shared_ptr<DataFileTest> *)operator_new(0x28);
  DataFileTest::DataFileTest
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
             (char *)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>
            ((shared_ptr<DataFileTest> *)in_stack_fffffffffffff890,
             (DataFileTest *)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_388,"&DataFileTest::testWriteGenericByName",0x25);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_3b8 = DataFileTest::testWriteGenericByName;
  local_3b0 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            ((TestMethod)pmVar3,pcVar2,tc_file,(size_t)pvVar1,user_test_case);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x216573);
  addReaderTests(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x2165f5);
  this = (test_suite *)operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::test_suite::test_suite
            (this,in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_3c0 = this;
  name = (const_string *)operator_new(0x28);
  DataFileTest::DataFileTest
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
             (char *)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>
            ((shared_ptr<DataFileTest> *)in_stack_fffffffffffff890,
             (DataFileTest *)in_stack_fffffffffffff888);
  ptVar7 = local_3c0;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_400,"&DataFileTest::testZip",0x16);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_430 = DataFileTest::testZip;
  local_428 = 0;
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((TestMethod)pmVar3,pcVar2,tc_file,(size_t)pvVar1,user_test_case);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x21678e);
  boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x2167f9);
  pvVar5 = operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::test_suite::test_suite(this,name,(const_string *)ptVar7,(size_t)ptVar4);
  local_438 = pvVar5;
  operator_new(0x28);
  DataFileTest::DataFileTest
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
             (char *)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>
            ((shared_ptr<DataFileTest> *)in_stack_fffffffffffff890,
             (DataFileTest *)in_stack_fffffffffffff888);
  boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x2168fb);
  ptVar6 = (test_suite *)operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::unit_test::test_suite::test_suite(this,name,(const_string *)ptVar7,(size_t)ptVar4);
  local_470 = ptVar6;
  operator_new(0x28);
  DataFileTest::DataFileTest
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
             (char *)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>
            ((shared_ptr<DataFileTest> *)in_stack_fffffffffffff890,
             (DataFileTest *)in_stack_fffffffffffff888);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_4b0,"&DataFileTest::testSchemaReadWrite",0x22);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff890,
             (pointer)in_stack_fffffffffffff888);
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_4e0 = DataFileTest::testSchemaReadWrite;
  local_4d8 = 0;
  boost::unit_test::make_test_case<DataFileTest,DataFileTest>
            ((TestMethod)pmVar3,pcVar2,tc_file,(size_t)pvVar1,user_test_case);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x216a6f);
  ptVar7 = local_470;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_4f0,"&DataFileTest::testCleanup",0x1a);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)ptVar7,(pointer)in_stack_fffffffffffff888);
  expected_failures = &stack0xfffffffffffffaf0;
  boost::shared_ptr<DataFileTest>::shared_ptr(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((TestMethod)pmVar3,pcVar2,tc_file,(size_t)pvVar1,user_test_case);
  boost::unit_test::test_suite::add
            (ptVar7,&ptVar4->super_test_unit,(counter_t)expected_failures,timeout);
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x216b3b);
  pmVar3 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add
            (ptVar7,&ptVar4->super_test_unit,(counter_t)expected_failures,
             (uint)((ulong)pmVar3 >> 0x20));
  boost::shared_ptr<DataFileTest>::~shared_ptr((shared_ptr<DataFileTest> *)0x216b8f);
  return (test_suite *)0x0;
}

Assistant:

test_suite*
init_unit_test_suite( int argc, char* argv[] )
{
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test1.df");
        shared_ptr<DataFileTest> t1(new DataFileTest("test1.df", sch, isch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testWrite, t1));
        addReaderTests(ts, t1);
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test2.df");
        shared_ptr<DataFileTest> t2(new DataFileTest("test2.df", sch, isch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testWriteGeneric, t2));
        addReaderTests(ts, t2);
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test3.df");
        shared_ptr<DataFileTest> t3(new DataFileTest("test3.df", dsch, dblsch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testWriteDouble, t3));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testReadDouble, t3));
        ts->add(
            BOOST_CLASS_TEST_CASE(&DataFileTest::testReadDoubleTwoStep, t3));
        ts->add(BOOST_CLASS_TEST_CASE(
            &DataFileTest::testReadDoubleTwoStepProject, t3));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testCleanup, t3));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test4.df");
        shared_ptr<DataFileTest> t4(new DataFileTest("test4.df", dsch, dblsch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testTruncate, t4));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testCleanup, t4));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test5.df");
        shared_ptr<DataFileTest> t5(new DataFileTest("test5.df", sch, isch));
        ts->add(
            BOOST_CLASS_TEST_CASE(&DataFileTest::testWriteGenericByName, t5));
        addReaderTests(ts, t5);
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test6.df");
        shared_ptr<DataFileTest> t6(new DataFileTest("test6.df", dsch, dblsch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testZip, t6));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test8.df");
        shared_ptr<DataFileTest> t8(new DataFileTest("test8.df", dsch, dblsch));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test7.df");
        shared_ptr<DataFileTest> t7(new DataFileTest("test7.df", fsch, fsch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testSchemaReadWrite, t7));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testCleanup, t7));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    return 0;
}